

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O2

void __thiscall ParallelManager::term(ParallelManager *this,function<void_()> *term_func)

{
  std::mutex::lock(&this->m_lock);
  if (this->m_term_done == false) {
    std::function<void_()>::operator()(term_func);
    this->m_term_done = true;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void term(std::function<void(void)> term_func)
	{
		std::lock_guard<std::mutex> lck(m_lock);
		if (!m_term_done)
		{
			term_func();
			m_term_done = true;
		}
	}